

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

int start_packet(vorb *f)

{
  int iVar1;
  vorb *in_RDI;
  vorb *in_stack_ffffffffffffffe8;
  
  while( true ) {
    if (in_RDI->next_seg != -1) {
      in_RDI->last_seg = 0;
      in_RDI->valid_bits = 0;
      in_RDI->packet_bytes = 0;
      in_RDI->bytes_in_seg = '\0';
      return 1;
    }
    iVar1 = start_page(in_stack_ffffffffffffffe8);
    if (iVar1 == 0) break;
    if ((in_RDI->page_flag & 1) != 0) {
      iVar1 = error(in_RDI,VORBIS_continued_packet_flag_invalid);
      return iVar1;
    }
  }
  return 0;
}

Assistant:

static int start_packet(vorb *f)
{
   while (f->next_seg == -1) {
      if (!start_page(f)) return FALSE;
      if (f->page_flag & PAGEFLAG_continued_packet)
         return error(f, VORBIS_continued_packet_flag_invalid);
   }
   f->last_seg = FALSE;
   f->valid_bits = 0;
   f->packet_bytes = 0;
   f->bytes_in_seg = 0;
   // f->next_seg is now valid
   return TRUE;
}